

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

void __thiscall skiwi::Lambda::Lambda(Lambda *this,Lambda *param_1)

{
  uint64_t uVar1;
  int iVar2;
  undefined7 uVar3;
  Lambda *param_1_local;
  Lambda *this_local;
  
  this->variable_arity = param_1->variable_arity;
  iVar2 = param_1->column_nr;
  this->line_nr = param_1->line_nr;
  this->column_nr = iVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->variables,&param_1->variables);
  std::
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ::vector(&this->body,&param_1->body);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->free_variables,&param_1->free_variables);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->assignable_variables,&param_1->assignable_variables);
  this->scan_index = param_1->scan_index;
  uVar3 = *(undefined7 *)&param_1->field_0x89;
  uVar1 = param_1->pre_scan_index;
  this->tail_position = param_1->tail_position;
  *(undefined7 *)&this->field_0x89 = uVar3;
  this->pre_scan_index = uVar1;
  std::vector<skiwi::liveness_range,_std::allocator<skiwi::liveness_range>_>::vector
            (&this->live_ranges,&param_1->live_ranges);
  std::__cxx11::string::string((string *)&this->filename,(string *)&param_1->filename);
  return;
}

Assistant:

Lambda() : line_nr(-1), column_nr(-1), variable_arity(false), tail_position(false), scan_index(0), pre_scan_index(0) {}